

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_map_equal_integer(void)

{
  size_type sVar1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *ppVar2;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_01;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_02;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_03;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_04;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_05;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_06;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_bc0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_ba8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_b90;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_b78;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_b60;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_b48;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_b30;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_b18;
  undefined1 local_b09;
  basic_variable<std::allocator<char>_> local_b08;
  int local_ad4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_ad0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_ac8;
  undefined1 local_a68 [77];
  undefined1 local_a1b [2];
  undefined1 local_a19;
  basic_variable<std::allocator<char>_> local_a18;
  int local_9e4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_9e0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_9d8;
  undefined1 local_978 [77];
  undefined1 local_92b [2];
  undefined1 local_929;
  basic_variable<std::allocator<char>_> local_928;
  int local_8f4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_8f0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_8e8;
  undefined1 local_888 [77];
  undefined1 local_83b [2];
  undefined1 local_839;
  basic_variable<std::allocator<char>_> local_838;
  int local_804;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_800;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_7f8;
  undefined1 local_798 [77];
  undefined1 local_74b [2];
  undefined1 local_749;
  basic_variable<std::allocator<char>_> local_748;
  basic_variable<std::allocator<char>_> local_718;
  undefined1 local_6db [2];
  undefined1 local_6d9;
  basic_variable<std::allocator<char>_> local_6d8;
  basic_variable<std::allocator<char>_> local_6a8;
  undefined1 local_66b [2];
  undefined1 local_669;
  basic_variable<std::allocator<char>_> local_668;
  basic_variable<std::allocator<char>_> local_638;
  undefined1 local_5fb [2];
  undefined1 local_5f9;
  basic_variable<std::allocator<char>_> local_5f8;
  basic_variable<std::allocator<char>_> local_5c8;
  undefined1 local_596 [2];
  undefined4 local_594;
  undefined4 local_590;
  uint big_1;
  uint zero_1;
  int local_554;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_550;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_548;
  undefined1 local_4e8 [77];
  undefined1 local_49b [2];
  undefined1 local_499;
  basic_variable<std::allocator<char>_> local_498;
  int local_464;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_460;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_458;
  undefined1 local_3f8 [77];
  undefined1 local_3ab [2];
  undefined1 local_3a9;
  basic_variable<std::allocator<char>_> local_3a8;
  int local_374;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_370;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_368;
  undefined1 local_308 [77];
  undefined1 local_2bb [2];
  undefined1 local_2b9;
  basic_variable<std::allocator<char>_> local_2b8;
  int local_284;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_280;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_278;
  undefined1 local_218 [77];
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_12 [2];
  undefined4 local_10;
  undefined4 local_c;
  int big;
  int zero;
  
  local_c = 0;
  local_10 = 0x7fffffff;
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_78,0);
  local_12[0] = trial::dynamic::operator==(&local_48,&local_78);
  local_85[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xddb,"void equality_suite::compare_map_equal_integer()",local_12,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_e8,0);
  local_87[0] = trial::dynamic::operator!=(&local_b8,&local_e8);
  local_e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xddc,"void equality_suite::compare_map_equal_integer()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_158,0x7fffffff);
  local_eb[0] = trial::dynamic::operator==(&local_128,&local_158);
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xddd,"void equality_suite::compare_map_equal_integer()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_1c8,0x7fffffff);
  local_15b[0] = trial::dynamic::operator!=(&local_198,&local_1c8);
  local_1c9 = '\x01';
  sVar1 = 0xdde;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdde,"void equality_suite::compare_map_equal_integer()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  local_280 = &local_278;
  local_284 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_280,(char (*) [6])"alpha",&local_284);
  local_218._0_8_ = &local_278;
  local_218._8_8_ = 1;
  init._M_len = sVar1;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),
             (basic_map<std::allocator<char>_> *)local_218._0_8_,init);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_2b8,0);
  local_1cb[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),&local_2b8);
  local_2b9 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xde0,"void equality_suite::compare_map_equal_integer()",local_1cb,&local_2b9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10));
  ppVar2 = &local_278;
  local_b18 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_218;
  do {
    local_b18 = local_b18 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_b18);
  } while (local_b18 != ppVar2);
  local_370 = &local_368;
  local_374 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_370,(char (*) [6])"alpha",&local_374);
  local_308._0_8_ = &local_368;
  local_308._8_8_ = 1;
  init_00._M_len = (size_type)ppVar2;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_308 + 0x10),
             (basic_map<std::allocator<char>_> *)local_308._0_8_,init_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_3a8,0);
  local_2bb[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_308 + 0x10),&local_3a8);
  local_3a9 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xde1,"void equality_suite::compare_map_equal_integer()",local_2bb,&local_3a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_308 + 0x10));
  ppVar2 = &local_368;
  local_b30 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_308;
  do {
    local_b30 = local_b30 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_b30);
  } while (local_b30 != ppVar2);
  local_460 = &local_458;
  local_464 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_460,(char (*) [6])"alpha",&local_464);
  local_3f8._0_8_ = &local_458;
  local_3f8._8_8_ = 1;
  init_01._M_len = (size_type)ppVar2;
  init_01._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_3f8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_3f8._0_8_,init_01);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_498,0x7fffffff);
  local_3ab[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_3f8 + 0x10),&local_498);
  local_499 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xde2,"void equality_suite::compare_map_equal_integer()",local_3ab,&local_499);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_3f8 + 0x10));
  ppVar2 = &local_458;
  local_b48 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_3f8;
  do {
    local_b48 = local_b48 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_b48);
  } while (local_b48 != ppVar2);
  local_550 = &local_548;
  local_554 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_550,(char (*) [6])"alpha",&local_554);
  local_4e8._0_8_ = &local_548;
  local_4e8._8_8_ = 1;
  init_02._M_len = (size_type)ppVar2;
  init_02._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_4e8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_4e8._0_8_,init_02);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)&zero_1,0x7fffffff);
  local_49b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_4e8 + 0x10),
                            (basic_variable<std::allocator<char>_> *)&zero_1);
  big_1._3_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xde3,"void equality_suite::compare_map_equal_integer()",local_49b,(long)&big_1 + 3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&zero_1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_4e8 + 0x10));
  local_b60 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_4e8;
  do {
    local_b60 = local_b60 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_b60);
  } while (local_b60 != &local_548);
  local_590 = 0;
  local_594 = 0xffffffff;
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_5f8,0);
  local_596[0] = trial::dynamic::operator==(&local_5c8,&local_5f8);
  local_5f9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xde9,"void equality_suite::compare_map_equal_integer()",local_596,&local_5f9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5c8);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_668,0);
  local_5fb[0] = trial::dynamic::operator!=(&local_638,&local_668);
  local_669 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdea,"void equality_suite::compare_map_equal_integer()",local_5fb,&local_669);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_668);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_638);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            (&local_6d8,0xffffffff);
  local_66b[0] = trial::dynamic::operator==(&local_6a8,&local_6d8);
  local_6d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdeb,"void equality_suite::compare_map_equal_integer()",local_66b,&local_6d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6a8);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            (&local_748,0xffffffff);
  local_6db[0] = trial::dynamic::operator!=(&local_718,&local_748);
  local_749 = '\x01';
  sVar1 = 0xdec;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdec,"void equality_suite::compare_map_equal_integer()",local_6db,&local_749);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_748);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_718);
  local_800 = &local_7f8;
  local_804 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_800,(char (*) [6])"alpha",&local_804);
  local_798._0_8_ = &local_7f8;
  local_798._8_8_ = 1;
  init_03._M_len = sVar1;
  init_03._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_798 + 0x10),
             (basic_map<std::allocator<char>_> *)local_798._0_8_,init_03);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_838,0);
  local_74b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_798 + 0x10),&local_838);
  local_839 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdee,"void equality_suite::compare_map_equal_integer()",local_74b,&local_839);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_838);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_798 + 0x10));
  ppVar2 = &local_7f8;
  local_b78 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_798;
  do {
    local_b78 = local_b78 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_b78);
  } while (local_b78 != ppVar2);
  local_8f0 = &local_8e8;
  local_8f4 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_8f0,(char (*) [6])"alpha",&local_8f4);
  local_888._0_8_ = &local_8e8;
  local_888._8_8_ = 1;
  init_04._M_len = (size_type)ppVar2;
  init_04._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_888 + 0x10),
             (basic_map<std::allocator<char>_> *)local_888._0_8_,init_04);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_928,0);
  local_83b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_888 + 0x10),&local_928);
  local_929 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdef,"void equality_suite::compare_map_equal_integer()",local_83b,&local_929);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_928);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_888 + 0x10));
  ppVar2 = &local_8e8;
  local_b90 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_888;
  do {
    local_b90 = local_b90 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_b90);
  } while (local_b90 != ppVar2);
  local_9e0 = &local_9d8;
  local_9e4 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_9e0,(char (*) [6])"alpha",&local_9e4);
  local_978._0_8_ = &local_9d8;
  local_978._8_8_ = 1;
  init_05._M_len = (size_type)ppVar2;
  init_05._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_978 + 0x10),
             (basic_map<std::allocator<char>_> *)local_978._0_8_,init_05);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            (&local_a18,0xffffffff);
  local_92b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_978 + 0x10),&local_a18);
  local_a19 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdf0,"void equality_suite::compare_map_equal_integer()",local_92b,&local_a19);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a18);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_978 + 0x10));
  ppVar2 = &local_9d8;
  local_ba8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_978;
  do {
    local_ba8 = local_ba8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_ba8);
  } while (local_ba8 != ppVar2);
  local_ad0 = &local_ac8;
  local_ad4 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_ad0,(char (*) [6])"alpha",&local_ad4);
  local_a68._0_8_ = &local_ac8;
  local_a68._8_8_ = 1;
  init_06._M_len = (size_type)ppVar2;
  init_06._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_a68 + 0x10),
             (basic_map<std::allocator<char>_> *)local_a68._0_8_,init_06);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            (&local_b08,0xffffffff);
  local_a1b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_a68 + 0x10),&local_b08);
  local_b09 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdf1,"void equality_suite::compare_map_equal_integer()",local_a1b,&local_b09);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b08);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_a68 + 0x10));
  local_bc0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_a68;
  do {
    local_bc0 = local_bc0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_bc0);
  } while (local_bc0 != &local_ac8);
  return;
}

Assistant:

void compare_map_equal_integer()
{
    {
        const auto zero = 0;
        const auto big = std::numeric_limits<signed int>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != variable(big), true);

        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != variable(big), true);
    }
    {
        const auto zero = 0U;
        const auto big = std::numeric_limits<unsigned int>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != variable(big), true);

        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != variable(big), true);
    }
}